

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

bool ParseUInt16(string_view str,uint16_t *out)

{
  bool bVar1;
  char *__first;
  ulong uVar2;
  ulong uVar3;
  char *__last;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  __integer_from_chars_result_type<unsigned_short> _Var6;
  unsigned_short result;
  uint16_t local_1a;
  long local_18;
  
  __first = str._M_str;
  uVar2 = str._M_len;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar2 < 2) {
    if (uVar2 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 1;
      if (*__first == '+') goto LAB_001571c6;
    }
  }
  else {
    uVar3 = uVar2;
    if (*__first == '+') {
      if (__first[1] == '-') {
        bVar1 = false;
        goto LAB_0015720c;
      }
LAB_001571c6:
      uVar3 = uVar2 - 1;
      __first = __first + 1;
    }
  }
  __last = __first + uVar3;
  _Var6 = std::from_chars<unsigned_short>(__first,__last,&local_1a,10);
  bVar4 = _Var6.ptr == __last;
  bVar5 = _Var6.ec == 0;
  bVar1 = bVar5 && bVar4;
  if ((out != (uint16_t *)0x0) && (bVar5 && bVar4)) {
    *out = local_1a;
    bVar1 = true;
  }
LAB_0015720c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool ParseUInt16(std::string_view str, uint16_t* out)
{
    return ParseIntegral<uint16_t>(str, out);
}